

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode expect100(Curl_easy *data,connectdata *conn,Curl_send_buffer *req_buffer)

{
  undefined1 *puVar1;
  _Bool _Var2;
  ushort uVar3;
  CURLcode CVar4;
  char *headerline;
  Curl_send_buffer *local_18;
  
  puVar1 = &(data->state).field_0x515;
  *puVar1 = *puVar1 & 0xfe;
  local_18 = req_buffer;
  _Var2 = use_http_1_1plus(data,conn);
  if ((_Var2) && (conn->httpversion < 0x14)) {
    headerline = Curl_checkheaders(conn,"Expect");
    if (headerline == (char *)0x0) {
      CVar4 = Curl_add_bufferf(&local_18,"Expect: 100-continue\r\n");
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      uVar3 = (ushort)*(undefined4 *)&(data->state).field_0x514 | 0x100;
    }
    else {
      _Var2 = Curl_compareheader(headerline,"Expect:","100-continue");
      uVar3 = (ushort)*(undefined4 *)&(data->state).field_0x514 & 0xfeff | (ushort)_Var2 << 8;
    }
    *(ushort *)&(data->state).field_0x514 = uVar3;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode expect100(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_send_buffer *req_buffer)
{
  CURLcode result = CURLE_OK;
  data->state.expect100header = FALSE; /* default to false unless it is set
                                          to TRUE below */
  if(use_http_1_1plus(data, conn) &&
     (conn->httpversion < 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    const char *ptr = Curl_checkheaders(conn, "Expect");
    if(ptr) {
      data->state.expect100header =
        Curl_compareheader(ptr, "Expect:", "100-continue");
    }
    else {
      result = Curl_add_bufferf(&req_buffer,
                                "Expect: 100-continue\r\n");
      if(!result)
        data->state.expect100header = TRUE;
    }
  }

  return result;
}